

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNDescr.cpp
# Opt level: O3

void __thiscall NaNeuralNetDescr::MakeDefaultDelays(NaNeuralNetDescr *this)

{
  NaReal *pNVar1;
  uint uVar2;
  
  NaVector::new_dim(&this->vInputDelays,this->nInputsRepeat);
  NaVector::new_dim(&this->vOutputDelays,this->nOutputsRepeat);
  if (this->nInputsRepeat != 0) {
    uVar2 = 0;
    do {
      pNVar1 = NaVector::operator[](&this->vInputDelays,uVar2);
      *pNVar1 = (double)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->nInputsRepeat);
  }
  if (this->nOutputsRepeat != 0) {
    uVar2 = 0;
    do {
      pNVar1 = NaVector::operator[](&this->vOutputDelays,uVar2);
      *pNVar1 = (double)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->nOutputsRepeat);
  }
  return;
}

Assistant:

void
NaNeuralNetDescr::MakeDefaultDelays ()
{
    vInputDelays.new_dim(nInputsRepeat);
    vOutputDelays.new_dim(nOutputsRepeat);

    /* default delays */
    unsigned	i;
    for(i = 0; i < nInputsRepeat; ++i)
      vInputDelays[i] = i;
    for(i = 0; i < nOutputsRepeat; ++i)
      vOutputDelays[i] = i;
}